

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O2

void __thiscall
lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::setup
          (DynamicLineage<std::vector<double,_std::allocator<double>_>_> *this)

{
  Data *pDVar1;
  pointer puVar2;
  ProblemGraph *pPVar3;
  pointer puVar4;
  pointer pEVar5;
  long lVar6;
  unsigned_long uVar7;
  size_t edge;
  ulong uVar8;
  value_type_conflict2 vVar9;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  pDVar1 = this->data_;
  puVar2 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar3 = pDVar1->problemGraph;
  puVar4 = (this->parents_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar7 = 0;
  for (lVar6 = 0; (pointer)((long)puVar2 + lVar6) != puVar4; lVar6 = lVar6 + 8) {
    puVar2[uVar7] = uVar7;
    uVar7 = uVar7 + 1;
  }
  lVar6 = 8;
  for (uVar8 = 0;
      pEVar5 = (pPVar3->graph_).edges_.
               super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)*(pointer *)
                             ((long)&(pPVar3->graph_).edges_.
                                     super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                                     ._M_impl.super__Vector_impl_data + 8) - (long)pEVar5 >> 4);
      uVar8 = uVar8 + 1) {
    updateEdgeWeight(this,*(size_t *)((long)pEVar5->vertexIndices_ + lVar6 + -8),
                     *(size_t *)((long)pEVar5->vertexIndices_ + lVar6),
                     (pDVar1->costs).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8]);
    lVar6 = lVar6 + 0x10;
  }
  pDVar1 = this->data_;
  getSolution((Solution *)&local_40,this);
  vVar9 = evaluate<lineage::Data>(pDVar1,(Solution *)&local_40);
  this->objective_ = vVar9;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return;
}

Assistant:

inline void setup()
    {
        const auto& graph = data_.problemGraph.graph();
        const auto& costs = data_.costs;
        std::iota(parents_.begin(), parents_.end(), 0);

        for (size_t edge = 0; edge < graph.numberOfEdges(); ++edge) {

            const auto& v0 = graph.vertexOfEdge(edge, 0);
            const auto& v1 = graph.vertexOfEdge(edge, 1);

            updateEdgeWeight(v0, v1, costs[edge]);
        }
        objective_ = evaluate(data_, getSolution());
    }